

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallTargetGenerator::AddInstallNamePatchRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  cmMakefile *this_00;
  cmGeneratorTarget *this_01;
  bool bVar1;
  TargetType TVar2;
  int iVar3;
  char *pcVar4;
  cmComputeLinkInformation *this_02;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *psVar5;
  mapped_type *pmVar6;
  _Rb_tree_node_base *p_Var7;
  ostream *poVar8;
  Indent IVar9;
  string new_id;
  string fname;
  string for_install;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  install_name_remap;
  string installNameTool;
  string local_110;
  string *local_f0;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [32];
  _Rb_tree_node_base *local_88;
  size_t local_80;
  string *local_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  if ((this->ImportLibrary == false) &&
     (((local_f0 = config, local_78 = toDestDirPath,
       TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == SHARED_LIBRARY ||
       (TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == MODULE_LIBRARY)) ||
      (TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == EXECUTABLE)))) {
    this_00 = this->Target->Target->Makefile;
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CMAKE_INSTALL_NAME_TOOL","")
    ;
    pcVar4 = cmMakefile::GetSafeDefinition(this_00,(string *)local_a8);
    std::__cxx11::string::string((string *)&local_70,pcVar4,(allocator *)&local_110);
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    if (local_68 != 0) {
      local_a8._24_8_ = local_a8 + 8;
      local_a8._8_4_ = _S_red;
      local_a8._16_8_ = 0;
      local_80 = 0;
      local_88 = (_Rb_tree_node_base *)local_a8._24_8_;
      this_02 = cmGeneratorTarget::GetLinkInformation(this->Target,local_f0);
      if (this_02 != (cmComputeLinkInformation *)0x0) {
        psVar5 = cmComputeLinkInformation::GetSharedLibrariesLinked(this_02);
        for (p_Var7 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var7 != &(psVar5->_M_t)._M_impl.super__Rb_tree_header;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          this_01 = *(cmGeneratorTarget **)(p_Var7 + 1);
          bVar1 = cmGeneratorTarget::IsImported(this_01);
          if (!bVar1) {
            cmGeneratorTarget::GetInstallNameDirForBuildTree(&local_110,this_01,local_f0);
            cmGeneratorTarget::GetInstallNameDirForInstallTree_abi_cxx11_(&local_c8,this_01);
            if ((local_110._M_string_length != local_c8._M_string_length) ||
               ((local_110._M_string_length != 0 &&
                (iVar3 = bcmp(local_110._M_dataplus._M_p,local_c8._M_dataplus._M_p,
                              local_110._M_string_length), iVar3 != 0)))) {
              GetInstallFilename(&local_e8,this_01,local_f0,NameSO);
              std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_e8._M_dataplus._M_p);
              std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8._M_dataplus._M_p);
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_a8,&local_110);
              std::__cxx11::string::_M_assign((string *)pmVar6);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,
                              CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                       local_110.field_2._M_local_buf[0]) + 1);
            }
          }
        }
      }
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      local_110._M_string_length = 0;
      local_110.field_2._M_local_buf[0] = '\0';
      TVar2 = cmGeneratorTarget::GetType(this->Target);
      if (TVar2 == SHARED_LIBRARY) {
        cmGeneratorTarget::GetInstallNameDirForBuildTree(&local_c8,this->Target,local_f0);
        cmGeneratorTarget::GetInstallNameDirForInstallTree_abi_cxx11_(&local_e8,this->Target);
        cmGeneratorTarget::IsFrameworkOnApple(this->Target);
        if ((local_c8._M_string_length != local_e8._M_string_length) ||
           ((local_c8._M_string_length != 0 &&
            (iVar3 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,
                          local_c8._M_string_length), iVar3 != 0)))) {
          std::__cxx11::string::_M_assign((string *)&local_110);
          GetInstallFilename(&local_50,this->Target,local_f0,NameSO);
          std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_80 != 0 || local_110._M_string_length != 0) {
        IVar9.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            IVar9.Level = IVar9.Level + -1;
          } while (IVar9.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"execute_process(COMMAND \"",0x19);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_68);
        std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
        if (local_110._M_string_length != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
          IVar9.Level = indent.Level;
          if (0 < indent.Level) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
              IVar9.Level = IVar9.Level + -1;
            } while (IVar9.Level != 0);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"  -id \"",7);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,local_110._M_dataplus._M_p,local_110._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
        }
        p_Var7 = (_Rb_tree_node_base *)local_a8._24_8_;
        if ((_Rb_tree_node_base *)local_a8._24_8_ != (_Rb_tree_node_base *)(local_a8 + 8)) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
            IVar9.Level = indent.Level;
            if (0 < indent.Level) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                IVar9.Level = IVar9.Level + -1;
              } while (IVar9.Level != 0);
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,"  -change \"",0xb);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" \"",3);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,*(char **)(p_Var7 + 2),(long)p_Var7[2]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          } while (p_Var7 != (_Rb_tree_node_base *)(local_a8 + 8));
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            indent.Level = indent.Level + -1;
          } while (indent.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"  \"",3);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(local_78->_M_dataplus)._M_p,local_78->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n",3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_a8);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddInstallNamePatchRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  if (this->ImportLibrary ||
      !(this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::EXECUTABLE)) {
    return;
  }

  // Fix the install_name settings in installed binaries.
  std::string installNameTool =
    this->Target->Target->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_NAME_TOOL");

  if (installNameTool.empty()) {
    return;
  }

  // Build a map of build-tree install_name to install-tree install_name for
  // shared libraries linked to this target.
  std::map<std::string, std::string> install_name_remap;
  if (cmComputeLinkInformation* cli =
        this->Target->GetLinkInformation(config)) {
    std::set<cmGeneratorTarget const*> const& sharedLibs =
      cli->GetSharedLibrariesLinked();
    for (std::set<cmGeneratorTarget const*>::const_iterator j =
           sharedLibs.begin();
         j != sharedLibs.end(); ++j) {
      cmGeneratorTarget const* tgt = *j;

      // The install_name of an imported target does not change.
      if (tgt->IsImported()) {
        continue;
      }

      // If the build tree and install tree use different path
      // components of the install_name field then we need to create a
      // mapping to be applied after installation.
      std::string for_build = tgt->GetInstallNameDirForBuildTree(config);
      std::string for_install = tgt->GetInstallNameDirForInstallTree();
      if (for_build != for_install) {
        // The directory portions differ.  Append the filename to
        // create the mapping.
        std::string fname = this->GetInstallFilename(tgt, config, NameSO);

        // Map from the build-tree install_name.
        for_build += fname;

        // Map to the install-tree install_name.
        for_install += fname;

        // Store the mapping entry.
        install_name_remap[for_build] = for_install;
      }
    }
  }

  // Edit the install_name of the target itself if necessary.
  std::string new_id;
  if (this->Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string for_build =
      this->Target->GetInstallNameDirForBuildTree(config);
    std::string for_install = this->Target->GetInstallNameDirForInstallTree();

    if (this->Target->IsFrameworkOnApple() && for_install.empty()) {
      // Frameworks seem to have an id corresponding to their own full
      // path.
      // ...
      // for_install = fullDestPath_without_DESTDIR_or_name;
    }

    // If the install name will change on installation set the new id
    // on the installed file.
    if (for_build != for_install) {
      // Prepare to refer to the install-tree install_name.
      new_id = for_install;
      new_id += this->GetInstallFilename(this->Target, config, NameSO);
    }
  }

  // Write a rule to run install_name_tool to set the install-tree
  // install_name value and references.
  if (!new_id.empty() || !install_name_remap.empty()) {
    os << indent << "execute_process(COMMAND \"" << installNameTool;
    os << "\"";
    if (!new_id.empty()) {
      os << "\n" << indent << "  -id \"" << new_id << "\"";
    }
    for (std::map<std::string, std::string>::const_iterator i =
           install_name_remap.begin();
         i != install_name_remap.end(); ++i) {
      os << "\n"
         << indent << "  -change \"" << i->first << "\" \"" << i->second
         << "\"";
    }
    os << "\n" << indent << "  \"" << toDestDirPath << "\")\n";
  }
}